

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink7.c
# Opt level: O2

Gia_Man_t * Unm_ManFree(Unm_Man_t *p)

{
  Gia_Man_t *p_00;
  
  p_00 = p->pNew;
  p->pNew = (Gia_Man_t *)0x0;
  Gia_ManHashStop(p_00);
  Vec_IntFreeP(&p_00->vLevels);
  Gia_ManSetRegNum(p_00,p->pGia->nRegs);
  Vec_WrdFreeP(&p->vTruths);
  Vec_IntFreeP(&p->vLeaves);
  Vec_IntFreeP(&p->vUsed);
  Vec_IntFreeP(&p->vId2Used);
  Hash_IntManStop(p->pHash);
  free(p);
  Gia_ManStop(p_00);
  return (Gia_Man_t *)0x0;
}

Assistant:

Gia_Man_t * Unm_ManFree( Unm_Man_t * p )
{
    Gia_Man_t * pTemp = p->pNew; p->pNew = NULL;
    Gia_ManHashStop( pTemp );
    Vec_IntFreeP( &pTemp->vLevels );
    Gia_ManSetRegNum( pTemp, Gia_ManRegNum(p->pGia) );
    // truth tables
    Vec_WrdFreeP( &p->vTruths );
    Vec_IntFreeP( &p->vLeaves );
    Vec_IntFreeP( &p->vUsed );
    Vec_IntFreeP( &p->vId2Used );
    // free data structures
    Hash_IntManStop( p->pHash );
    ABC_FREE( p );

    Gia_ManStop( pTemp );
    pTemp = NULL;

    return pTemp;
}